

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector4f.cpp
# Opt level: O0

Vector4f __thiscall Vector4f::normalized(Vector4f *this)

{
  Vector4f *this_00;
  int in_ESI;
  undefined4 in_register_00000034;
  Vector4f *in_RDI;
  float in_XMM0_Da;
  undefined1 auVar2 [16];
  undefined1 auVar4 [16];
  Vector4f VVar5;
  float length;
  undefined8 uVar1;
  undefined8 uVar3;
  
  this_00 = (Vector4f *)CONCAT44(in_register_00000034,in_ESI);
  abs(this_00,in_ESI);
  auVar2._0_4_ = this_00->m_elements[0] / in_XMM0_Da;
  auVar2._4_12_ = SUB6012((undefined1  [60])0x0,0);
  uVar1 = auVar2._0_8_;
  auVar4._0_4_ = this_00->m_elements[1] / in_XMM0_Da;
  auVar4._4_12_ = SUB6012((undefined1  [60])0x0,0);
  uVar3 = auVar4._0_8_;
  Vector4f(in_RDI,auVar2._0_4_,auVar4._0_4_,this_00->m_elements[2] / in_XMM0_Da,
           this_00->m_elements[3] / in_XMM0_Da);
  VVar5.m_elements[2] = (float)(int)uVar3;
  VVar5.m_elements[3] = (float)(int)((ulong)uVar3 >> 0x20);
  VVar5.m_elements[0] = (float)(int)uVar1;
  VVar5.m_elements[1] = (float)(int)((ulong)uVar1 >> 0x20);
  return (Vector4f)VVar5.m_elements;
}

Assistant:

Vector4f Vector4f::normalized() const
{
	float length = abs();
	return Vector4f
		(
			m_elements[0] / length,
			m_elements[1] / length,
			m_elements[2] / length,
			m_elements[3] / length
		);
}